

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

void __thiscall sing::HttpContext::HttpContext(HttpContext *this,int fd)

{
  this->fd = fd;
  this->working = false;
  Buffer::Buffer(&this->input);
  Buffer::Buffer(&this->output);
  this->state = REQUEST_LINE;
  HttpRequest::HttpRequest(&this->request);
  HttpResponse::HttpResponse(&this->response);
  (this->timer).super___weak_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timer).super___weak_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (-1 < fd) {
    return;
  }
  __assert_fail("fd>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Http/HttpContext.cpp"
                ,9,"sing::HttpContext::HttpContext(int)");
}

Assistant:

HttpContext::HttpContext(int fd)
    :state(REQUEST_LINE),fd(fd),working(false){
    assert(fd>=0);
}